

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGetMemoryCommitment.cpp
# Opt level: O0

bool __thiscall
vkt::api::MemoryCommitmentTestInstance::isDeviceMemoryCommitmentOk
          (MemoryCommitmentTestInstance *this,VkMemoryRequirements memoryRequirements)

{
  bool bVar1;
  VkAllocationCallbacks *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VkPhysicalDevice physicalDevice_00;
  InstanceInterface *vk;
  VkDevice device_00;
  Handle<(vk::HandleType)7> *pHVar6;
  ulong local_2b0;
  VkDeviceSize pCommittedMemoryInBytes;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  DeviceInterface *vkd;
  VkDevice device;
  VkMemoryAllocateInfo memAllocInfo;
  TextureFormat TStack_250;
  deUint32 memTypeNdx;
  void *local_248;
  VkDeviceSize pixelDataSize;
  VkPhysicalDeviceMemoryProperties pMemoryProperties;
  VkMemoryPropertyFlags propertyFlag;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  VkFormat colorFormat;
  MemoryCommitmentTestInstance *this_local;
  
  physicalDevice_00 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pMemoryProperties.memoryHeaps[0xf]._12_4_ = 0x10;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&pixelDataSize,vk,physicalDevice_00);
  iVar3 = tcu::Vector<int,_2>::x(&this->m_renderSize);
  iVar4 = tcu::Vector<int,_2>::y(&this->m_renderSize);
  TStack_250 = ::vk::mapVkFormat(VK_FORMAT_R32_UINT);
  iVar5 = tcu::TextureFormat::getPixelSize(&stack0xfffffffffffffdb0);
  local_248 = (void *)(long)(iVar3 * iVar4 * iVar5);
  for (memAllocInfo._28_4_ = 0; (uint)memAllocInfo._28_4_ < 0x20;
      memAllocInfo._28_4_ = memAllocInfo._28_4_ + 1) {
    if ((pMemoryProperties.memoryTypes[(ulong)(uint)memAllocInfo._28_4_ - 1].propertyFlags & 0x10)
        == 0x10) {
      device._0_4_ = 5;
      memAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      memAllocInfo._4_4_ = 0;
      memAllocInfo.pNext = local_248;
      memAllocInfo.allocationSize._0_4_ = memAllocInfo._28_4_;
      device_00 = Context::getDevice((this->super_TestInstance).m_context);
      memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           Context::getDeviceInterface((this->super_TestInstance).m_context);
      ::vk::allocateMemory
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&pCommittedMemoryInBytes,
                 (DeviceInterface *)
                 memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator,
                 device_00,(VkMemoryAllocateInfo *)&device,(VkAllocationCallbacks *)0x0);
      pVVar2 = memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
      local_2b0 = 0;
      pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::get
                         ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&pCommittedMemoryInBytes);
      (**(code **)((long)pVVar2->pUserData + 0x58))(pVVar2,device_00,pHVar6->m_internal,&local_2b0);
      bVar1 = local_2b0 <= memoryRequirements.size;
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)7>_> *)&pCommittedMemoryInBytes);
      if (bVar1) goto LAB_008a906a;
    }
  }
  this_local._7_1_ = 0;
LAB_008a906a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MemoryCommitmentTestInstance::isDeviceMemoryCommitmentOk(const VkMemoryRequirements memoryRequirements)
{
	const VkFormat							colorFormat			= VK_FORMAT_R32_UINT;
	const VkPhysicalDevice					physicalDevice		= m_context.getPhysicalDevice();
	const InstanceInterface&				vki					= m_context.getInstanceInterface();
	const VkMemoryPropertyFlags				propertyFlag		= VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;
	const VkPhysicalDeviceMemoryProperties	pMemoryProperties	= getPhysicalDeviceMemoryProperties(vki,physicalDevice);
	const VkDeviceSize						pixelDataSize		= m_renderSize.x() * m_renderSize.y() * mapVkFormat(colorFormat).getPixelSize();

	for (deUint32 memTypeNdx = 0u; memTypeNdx < VK_MAX_MEMORY_TYPES; ++memTypeNdx)
	{
		if((pMemoryProperties.memoryTypes[memTypeNdx].propertyFlags & propertyFlag) == propertyFlag) //if supports Lazy allocation
		{
			const VkMemoryAllocateInfo	memAllocInfo =
			{
				VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,		//	VkStructureType		sType
				NULL,										//	const void*			pNext
				pixelDataSize,								//	VkDeviceSize		allocationSize
				memTypeNdx									//	deUint32			memoryTypeIndex
			};
			const VkDevice			device					= m_context.getDevice();
			const DeviceInterface&	vkd						= m_context.getDeviceInterface();
			Move<VkDeviceMemory>	memory					= allocateMemory(vkd, device, &memAllocInfo, (const VkAllocationCallbacks*)DE_NULL);
			VkDeviceSize			pCommittedMemoryInBytes = 0u;
			vkd.getDeviceMemoryCommitment(device, memory.get(), &pCommittedMemoryInBytes);
			if(pCommittedMemoryInBytes <= memoryRequirements.size)
				return true;
		}
	}
	return false;
}